

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

out_of_range *
nlohmann::detail::out_of_range::
create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (int id_,string *what_arg,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *context)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator *this;
  string local_d8 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  allocator local_a1;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [20];
  int in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  string local_40 [64];
  
  this = &local_a1;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"out_of_range",this);
  exception::name(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  exception::
  diagnostics<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (in_stack_ffffffffffffff38);
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::operator+(__lhs,in_RDI);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::c_str();
  out_of_range((out_of_range *)this,(int)((ulong)__lhs >> 0x20),(char *)in_RDI);
  std::__cxx11::string::~string(local_40);
  return (out_of_range *)__lhs;
}

Assistant:

static out_of_range create(int id_, const std::string& what_arg, const BasicJsonType& context)
    {
        std::string w = exception::name("out_of_range", id_) + exception::diagnostics(context) + what_arg;
        return {id_, w.c_str()};
    }